

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_scandir_next(lua_State *L)

{
  int status;
  uv_fs_t *req;
  int iVar1;
  char *s;
  bool bVar2;
  uv_dirent_t ent;
  
  iVar1 = 1;
  req = (uv_fs_t *)luaL_checkudata(L,1,"uv_req");
  bVar2 = req->data != (void *)0x0;
  req->type = (uint)bVar2;
  if (!bVar2) {
    luaL_argerror(L,1,"Expected uv_fs_t");
  }
  status = uv_fs_scandir_next(req,&ent);
  if (status == -0xfff) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 0;
  }
  else if (status < 0) {
    luv_error(L,status);
    iVar1 = 3;
  }
  else {
    lua_pushstring(L,ent.name);
    switch(ent.type) {
    case UV_DIRENT_UNKNOWN:
      goto switchD_00147497_caseD_0;
    case UV_DIRENT_FILE:
      s = "file";
      break;
    case UV_DIRENT_DIR:
      s = "directory";
      break;
    case UV_DIRENT_LINK:
      s = "link";
      break;
    case UV_DIRENT_FIFO:
      s = "fifo";
      break;
    case UV_DIRENT_SOCKET:
      s = "socket";
      break;
    case UV_DIRENT_CHAR:
      s = "char";
      break;
    case UV_DIRENT_BLOCK:
      s = "block";
      break;
    default:
      s = "unknown";
    }
    lua_pushstring(L,s);
    iVar1 = 2;
  }
switchD_00147497_caseD_0:
  return iVar1;
}

Assistant:

static int luv_fs_scandir_next(lua_State* L) {
  uv_fs_t* req = luv_check_fs(L, 1);
  uv_dirent_t ent;
  int ret = uv_fs_scandir_next(req, &ent);
  if (ret == UV_EOF) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    req->data = NULL;
    uv_fs_req_cleanup(req);
    return 0;
  }
  if (ret < 0) return luv_error(L, ret);
  return luv_push_dirent(L, &ent, 0);
}